

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datanode_info.cc
# Opt level: O0

int __thiscall DatanodeInfo::Write(DatanodeInfo *this,ByteBuffer *buffer)

{
  undefined8 in_RSI;
  char *in_RDI;
  ByteBuffer *unaff_retaddr;
  int length;
  
  length = (int)((ulong)in_RSI >> 0x20);
  crail::ByteBuffer::PutInt(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  crail::ByteBuffer::PutInt(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  crail::ByteBuffer::PutInt(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  crail::ByteBuffer::PutBytes(unaff_retaddr,in_RDI,length);
  crail::ByteBuffer::PutInt(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  return 0;
}

Assistant:

int DatanodeInfo::Write(ByteBuffer &buffer) {
  buffer.PutInt(storage_type_);
  buffer.PutInt(storage_class_);
  buffer.PutInt(location_class_);
  buffer.PutBytes((char *)&ip_address_, 4);
  buffer.PutInt(port_);

  return 0;
}